

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O0

int __thiscall adjMaxtrix<char>::GetFirstVex(adjMaxtrix<char> *this,int v)

{
  size_type sVar1;
  int local_20;
  int col;
  int v_local;
  adjMaxtrix<char> *this_local;
  
  if ((-1 < v) &&
     (sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs), (ulong)(long)v < sVar1))
  {
    local_20 = 0;
    while( true ) {
      sVar1 = std::vector<char,_std::allocator<char>_>::size(&this->vexs);
      if (sVar1 <= (ulong)(long)local_20) {
        return -1;
      }
      if (this->edge[v][local_20] != this->MAX_WEIGHT) break;
      local_20 = local_20 + 1;
    }
    return local_20;
  }
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_2959);
  return -1;
}

Assistant:

int adjMaxtrix<dataType>::GetFirstVex(int v) {
	int col;
	if (v < 0 || v >= vexs.size()) {
		cout << "取第一个邻接顶点参数v越界";
		return -1;
	}
	//查找v顶点的，也就是第v行的第一个有效顶点，放回其列col
	for (col = 0; col < vexs.size(); col++) {
		if (edge[v][col] != MAX_WEIGHT)
			return col;
	}
	return -1;
}